

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall
ON_SubDComponentId::ToString
          (ON_SubDComponentId *this,bool bUnsetIsEmptyString,bool bDirectionPrefix)

{
  Type TVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte in_CL;
  undefined7 in_register_00000031;
  ON_SubDComponentId *this_00;
  char local_81;
  ON_wString local_68;
  ON_wString local_60;
  ON_SubDFaceCornerDex local_54;
  ON_SubDFaceCornerDex cdex;
  ON_wString local_48 [3];
  char local_2d;
  uint local_2c;
  char prefix;
  uint id;
  ON_wString str;
  bool bDirectionPrefix_local;
  bool bUnsetIsEmptyString_local;
  ON_SubDComponentId *this_local;
  
  this_00 = (ON_SubDComponentId *)CONCAT71(in_register_00000031,bUnsetIsEmptyString);
  str.m_s._6_1_ = in_CL & 1;
  str.m_s._7_1_ = bDirectionPrefix;
  ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffd8);
  local_2c = ComponentId(this_00);
  if (local_2c != 0) {
    if ((str.m_s._6_1_ & 1) == 0) {
      local_2d = '\0';
    }
    else {
      uVar3 = ComponentDirection(this_00);
      local_81 = '-';
      local_2d = local_81;
      if (uVar3 != 1) {
        local_81 = '+';
        local_2d = local_81;
      }
    }
    TVar1 = ComponentType(this_00);
    switch(TVar1) {
    case Unset:
      break;
    case Vertex:
      if (local_2d == '\0') {
        ON_wString::FormatToString((wchar_t *)local_48,L"v%u",(ulong)local_2c);
      }
      else {
        ON_wString::FormatToString
                  ((wchar_t *)local_48,L"%cv%u",(ulong)(uint)(int)local_2d,(ulong)local_2c);
      }
      ON_wString::operator=((ON_wString *)&stack0xffffffffffffffd8,local_48);
      ON_wString::~ON_wString(local_48);
      break;
    case Edge:
      if (local_2d == '\0') {
        ON_wString::FormatToString((wchar_t *)&stack0xffffffffffffffb0,L"e%u",(ulong)local_2c);
      }
      else {
        ON_wString::FormatToString
                  ((wchar_t *)&stack0xffffffffffffffb0,L"%ce%u",(ulong)(uint)(int)local_2d,
                   (ulong)local_2c);
      }
      ON_wString::operator=
                ((ON_wString *)&stack0xffffffffffffffd8,(ON_wString *)&stack0xffffffffffffffb0);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffb0);
      break;
    case Face:
      local_54 = FaceCornerDex(this_00);
      bVar2 = ON_SubDFaceCornerDex::IsSet(&local_54);
      uVar3 = local_2c;
      if (bVar2) {
        if (local_2d == '\0') {
          uVar4 = ON_SubDFaceCornerDex::CornerIndex(&local_54);
          ON_wString::FormatToString((wchar_t *)&local_60,L"f%u.%u",(ulong)uVar3,(ulong)uVar4);
        }
        else {
          uVar4 = (uint)local_2d;
          uVar5 = ON_SubDFaceCornerDex::CornerIndex(&local_54);
          ON_wString::FormatToString
                    ((wchar_t *)&local_60,L"%cf%u.%u",(ulong)uVar4,(ulong)uVar3,(ulong)uVar5);
        }
        ON_wString::operator=((ON_wString *)&stack0xffffffffffffffd8,&local_60);
        ON_wString::~ON_wString(&local_60);
      }
      else {
        if (local_2d == '\0') {
          ON_wString::FormatToString((wchar_t *)&local_68,L"f%u",(ulong)local_2c);
        }
        else {
          ON_wString::FormatToString
                    ((wchar_t *)&local_68,L"%cf%u",(ulong)(uint)(int)local_2d,(ulong)local_2c);
        }
        ON_wString::operator=((ON_wString *)&stack0xffffffffffffffd8,&local_68);
        ON_wString::~ON_wString(&local_68);
      }
    }
  }
  bVar2 = ON_wString::IsNotEmpty((ON_wString *)&stack0xffffffffffffffd8);
  if ((bVar2) || ((str.m_s._7_1_ & 1) != 0)) {
    ON_wString::ON_wString((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffd8);
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,"unset");
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDComponentId::ToString(bool bUnsetIsEmptyString, bool bDirectionPrefix) const
{
  ON_wString str;
  const unsigned id = this->ComponentId();
  if (id > 0)
  {
    const char prefix = bDirectionPrefix ? (1 == this->ComponentDirection() ? '-' : '+') : 0;
    switch (this->ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      str = (0 == prefix) ? ON_wString::FormatToString(L"v%u", id) : ON_wString::FormatToString(L"%cv%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Edge:
      str = (0 == prefix) ? ON_wString::FormatToString(L"e%u", id) : ON_wString::FormatToString(L"%ce%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFaceCornerDex cdex = this->FaceCornerDex();
      if (cdex.IsSet())
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u.%u", id, cdex.CornerIndex()) : ON_wString::FormatToString(L"%cf%u.%u", prefix, id, cdex.CornerIndex());
      else
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u", id) : ON_wString::FormatToString(L"%cf%u", prefix, id);
    }
    break;

    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }
  return (str.IsNotEmpty() || bUnsetIsEmptyString) ? str : ON_wString("unset");
}